

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool testing::internal::
     TupleMatches<std::tuple<testing::Matcher<unsigned_short>,testing::Matcher<std::chrono::duration<long,std::ratio<1l,1000l>>>>,std::tuple<unsigned_short,std::chrono::duration<long,std::ratio<1l,1000l>>>>
               (tuple<testing::Matcher<unsigned_short>,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                *matcher_tuple,
               tuple<unsigned_short,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
               *value_tuple)

{
  bool bVar1;
  tuple<unsigned_short,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *value_tuple_local;
  tuple<testing::Matcher<unsigned_short>,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  *matcher_tuple_local;
  
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<unsigned_short>,testing::Matcher<std::chrono::duration<long,std::ratio<1l,1000l>>>>,std::tuple<unsigned_short,std::chrono::duration<long,std::ratio<1l,1000l>>>>
                    (matcher_tuple,value_tuple);
  return bVar1;
}

Assistant:

bool TupleMatches(const MatcherTuple& matcher_tuple,
                  const ValueTuple& value_tuple) {
  // Makes sure that matcher_tuple and value_tuple have the same
  // number of fields.
  GTEST_COMPILE_ASSERT_(std::tuple_size<MatcherTuple>::value ==
                            std::tuple_size<ValueTuple>::value,
                        matcher_and_value_have_different_numbers_of_fields);
  return TuplePrefix<std::tuple_size<ValueTuple>::value>::Matches(matcher_tuple,
                                                                  value_tuple);
}